

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::CodeHolder::detach(CodeHolder *this,BaseEmitter *emitter)

{
  Error EVar1;
  uint uVar2;
  Error extraout_EAX;
  CodeHolder *pCVar3;
  CodeHolder *extraout_RAX;
  long in_RCX;
  size_t __n;
  size_t extraout_RDX;
  CodeHolder *pCVar4;
  long lVar5;
  long lVar6;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar1 = 2;
  }
  else if (emitter->_code == this) {
    if ((char)emitter->_emitterFlags < '\0') {
      EVar1 = 0;
      pCVar4 = (CodeHolder *)emitter;
    }
    else {
      pCVar4 = this;
      EVar1 = (*emitter->_vptr_BaseEmitter[0x11])(emitter);
    }
    pCVar3 = (CodeHolder *)(ulong)*(uint *)&this->field_0xd0;
    if (pCVar3 != (CodeHolder *)0x0) {
      in_RCX = *(long *)&this->_emitters;
      __n = (ulong)(*(uint *)&this->field_0xd0 - 1) << 3;
      pCVar4 = (CodeHolder *)0x0;
      do {
        if (*(BaseEmitter **)(in_RCX + (long)pCVar4 * 8) == emitter) goto LAB_00118253;
        pCVar4 = (CodeHolder *)&(pCVar4->_environment)._subArch;
        __n = __n - 8;
      } while (pCVar3 != pCVar4);
    }
    do {
      detach();
      pCVar3 = extraout_RAX;
      __n = extraout_RDX;
LAB_00118253:
      lVar5 = 0xffffffff;
    } while (pCVar4 == (CodeHolder *)0xffffffff);
    if (pCVar3 <= pCVar4) {
      detach();
      *(CodeHolder **)(lVar5 + 0x30) = pCVar4;
      uVar2 = *(uint *)(lVar5 + 0xd0);
      EVar1 = extraout_EAX;
      if ((ulong)uVar2 != 0) {
        lVar5 = *(long *)(lVar5 + 200);
        lVar6 = 0;
        do {
          EVar1 = (**(code **)(**(long **)(lVar5 + lVar6) + 0x90))();
          lVar6 = lVar6 + 8;
        } while ((ulong)uVar2 << 3 != lVar6);
      }
      return EVar1;
    }
    uVar2 = (int)pCVar3 - 1;
    *(uint *)&this->field_0xd0 = uVar2;
    if ((CodeHolder *)(ulong)uVar2 != pCVar4) {
      memmove((void *)(in_RCX + (long)pCVar4 * 8),(void *)(in_RCX + (long)pCVar4 * 8 + 8),__n);
    }
    emitter->_code = (CodeHolder *)0x0;
  }
  else {
    EVar1 = 3;
  }
  return EVar1;
}

Assistant:

Error CodeHolder::detach(BaseEmitter* emitter) noexcept {
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(emitter->_code != this))
    return DebugUtils::errored(kErrorInvalidState);

  // NOTE: We always detach if we were asked to, if error happens during
  // `emitter->onDetach()` we just propagate it, but the BaseEmitter will
  // be detached.
  Error err = kErrorOk;
  if (!emitter->isDestroyed())
    err = emitter->onDetach(this);

  // Disconnect CodeHolder <-> BaseEmitter.
  uint32_t index = _emitters.indexOf(emitter);
  ASMJIT_ASSERT(index != Globals::kNotFound);

  _emitters.removeAt(index);
  emitter->_code = nullptr;

  return err;
}